

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  iterator shared_font_atlas;
  bool in_stack_0000000f;
  State *in_stack_00000010;
  int mouseSupport;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  size_t in_stack_fffffffffffffe58;
  undefined6 in_stack_fffffffffffffe60;
  iterator in_stack_fffffffffffffe68;
  allocator<char> *in_stack_fffffffffffffe70;
  bool local_181;
  allocator<char> *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  char *__s;
  float fps_idle;
  float in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined1 mouseSupport_00;
  bool local_151;
  _Self local_138;
  byte local_12b;
  byte local_12a;
  allocator<char> local_129;
  string local_128 [32];
  _Self local_108;
  _Self in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff0c;
  string local_f0 [32];
  _Self local_d0;
  _Self local_c8;
  byte local_bb;
  byte local_ba;
  allocator<char> local_b9;
  string local_b8 [32];
  _Self local_98;
  _Self local_90 [3];
  allocator<char> local_71;
  string local_70 [32];
  _Self local_50;
  uint local_44;
  int local_4;
  
  local_4 = 0;
  (anonymous_namespace)::parseCmdArguments_abi_cxx11_
            (in_stack_ffffffffffffff0c,(char **)in_stack_ffffffffffffff00._M_node);
  std::allocator<char>::allocator();
  local_ba = 0;
  local_bb = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88
             ,in_stack_fffffffffffffe80);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffffe48,(key_type *)0x109d0f);
  local_90[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffe48);
  bVar1 = std::operator!=(&local_50,local_90);
  local_151 = true;
  if (!bVar1) {
    std::allocator<char>::allocator();
    local_ba = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    local_bb = 1;
    local_98._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(in_stack_fffffffffffffe48,(key_type *)0x109db0);
    local_c8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(in_stack_fffffffffffffe48);
    local_151 = std::operator!=(&local_98,&local_c8);
  }
  uVar2 = (uint)local_151;
  if ((local_bb & 1) != 0) {
    std::__cxx11::string::~string(local_b8);
  }
  if ((local_ba & 1) != 0) {
    std::allocator<char>::~allocator(&local_b9);
  }
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  __s = &stack0xffffffffffffff0f;
  local_44 = uVar2;
  std::allocator<char>::allocator();
  local_12a = 0;
  local_12b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar2,in_stack_fffffffffffffe90),__s,in_stack_fffffffffffffe80);
  shared_font_atlas =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffffe48,(key_type *)0x109ea8);
  local_d0._M_node = shared_font_atlas._M_node;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::end(in_stack_fffffffffffffe48);
  bVar1 = std::operator!=(&local_d0,(_Self *)&stack0xffffffffffffff00);
  local_181 = true;
  if (!bVar1) {
    in_stack_fffffffffffffe70 = &local_129;
    std::allocator<char>::allocator();
    local_12a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(uVar2,in_stack_fffffffffffffe90),__s,
               (allocator<char> *)shared_font_atlas._M_node);
    local_12b = 1;
    in_stack_fffffffffffffe68 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(in_stack_fffffffffffffe48,(key_type *)0x109f49);
    local_108._M_node = in_stack_fffffffffffffe68._M_node;
    local_138._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(in_stack_fffffffffffffe48);
    local_181 = std::operator!=(&local_108,&local_138);
  }
  mouseSupport_00 = (undefined1)(uVar2 >> 0x18);
  fps_idle = (float)((ulong)__s >> 0x20);
  if ((local_12b & 1) != 0) {
    std::__cxx11::string::~string(local_128);
  }
  if ((local_12a & 1) != 0) {
    std::allocator<char>::~allocator(&local_129);
  }
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff0f);
  if ((local_181 & 1U) == 0) {
    bVar1 = hnInit();
    if (bVar1) {
      ImGui::DebugCheckVersionAndDataLayout
                ((char *)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68._M_node,
                 CONCAT17(local_181,CONCAT16(bVar1,in_stack_fffffffffffffe60)),
                 in_stack_fffffffffffffe58,
                 CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),2,
                 (size_t)shared_font_atlas._M_node);
      ImGui::CreateContext((ImFontAtlas *)shared_font_atlas._M_node);
      g_screen = ImTui_ImplNcurses_Init((bool)mouseSupport_00,in_stack_fffffffffffffe90,fps_idle);
      ImTui_ImplText_Init();
      UI::State::changeColorScheme(in_stack_00000010,in_stack_0000000f);
      do {
        bVar1 = render_frame();
      } while (bVar1);
      ImTui_ImplText_Shutdown();
      ImTui_ImplNcurses_Shutdown();
      hnFree();
      local_4 = 0;
    }
    else {
      fprintf(_stderr,"Failed to initialize. Aborting\n");
      local_4 = -1;
    }
  }
  else {
    printf("Usage: hnterm [-m] [-h]\n");
    printf("    -m, --mouse : ncurses mouse support\n");
    printf("    -h, --help  : print this help\n");
    local_4 = -1;
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x10a2d4);
  return local_4;
}

Assistant:

int main([[maybe_unused]] int argc, [[maybe_unused]] char ** argv) {
#ifndef __EMSCRIPTEN__
    auto argm = parseCmdArguments(argc, argv);
    int mouseSupport = argm.find("--mouse") != argm.end() || argm.find("m") != argm.end();
    if (argm.find("--help") != argm.end() || argm.find("-h") != argm.end()) {
        printf("Usage: hnterm [-m] [-h]\n");
        printf("    -m, --mouse : ncurses mouse support\n");
        printf("    -h, --help  : print this help\n");
        return -1;
    }
#endif

    if (hnInit() == false) {
        fprintf(stderr, "Failed to initialize. Aborting\n");
        return -1;
    }

    IMGUI_CHECKVERSION();
    ImGui::CreateContext();

#ifdef __EMSCRIPTEN__
    g_screen = ImTui_ImplEmscripten_Init(true);
#else
    // when no changes occured - limit frame rate to 3.0 fps to save CPU
    g_screen = ImTui_ImplNcurses_Init(mouseSupport != 0, 60.0, 3.0);
#endif
    ImTui_ImplText_Init();

    stateUI.changeColorScheme(false);

#ifndef __EMSCRIPTEN__
    while (true) {
        if (render_frame() == false) break;
    }

    ImTui_ImplText_Shutdown();
    ImTui_ImplNcurses_Shutdown();
    hnFree();
#endif

    return 0;
}